

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

uint16 crnlib::etc1_block::pack_color5(uint r,uint g,uint b,bool scaled,uint bias)

{
  uint uVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,scaled) != 0) {
    r = (r * 0x1f + bias) / 0xff;
    g = (g * 0x1f + bias) / 0xff;
    b = (b * 0x1f + bias) / 0xff;
  }
  if (0x1e < r) {
    r = 0x1f;
  }
  if (0x1e < g) {
    g = 0x1f;
  }
  uVar1 = 0x1f;
  if (b < 0x1f) {
    uVar1 = b;
  }
  return (ushort)(r << 10) | (ushort)(g << 5) | (ushort)uVar1;
}

Assistant:

uint16 etc1_block::pack_color5(uint r, uint g, uint b, bool scaled, uint bias) {
  if (scaled) {
    r = (r * 31U + bias) / 255U;
    g = (g * 31U + bias) / 255U;
    b = (b * 31U + bias) / 255U;
  }

  r = math::minimum(r, 31U);
  g = math::minimum(g, 31U);
  b = math::minimum(b, 31U);

  return static_cast<uint16>(b | (g << 5U) | (r << 10U));
}